

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O0

string * __thiscall
cmServerResponse::ErrorMessage_abi_cxx11_(string *__return_storage_ptr__,cmServerResponse *this)

{
  cmServerResponse *this_local;
  
  if (this->m_Payload == PAYLOAD_ERROR) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_ErrorMessage);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmServerResponse::ErrorMessage() const
{
  if (this->m_Payload == PAYLOAD_ERROR) {
    return this->m_ErrorMessage;
  }
  return std::string();
}